

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

void __thiscall ccs::Value::str(Value *this)

{
  ToString local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  Value *local_10;
  Value *this_local;
  
  local_10 = this;
  accept<std::__cxx11::string,ccs::(anonymous_namespace)::ToString>(&local_30,this,&local_31);
  std::__cxx11::string::operator=((string *)&this->strVal_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Value::str()
  { strVal_ = accept<std::string>(ToString()); }